

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::UdpEdgeFieldSyntax>
          (DeepCloneVisitor *this,UdpEdgeFieldSyntax *node,BumpAllocator *alloc)

{
  UdpEdgeFieldSyntax *pUVar1;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone(&node->openParen,alloc);
  local_48 = parsing::Token::deepClone(&node->first,alloc);
  local_58 = parsing::Token::deepClone(&node->second,alloc);
  local_68 = parsing::Token::deepClone(&node->closeParen,alloc);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UdpEdgeFieldSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_38,&local_48,&local_58,&local_68);
  return (SyntaxNode *)pUVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }